

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O1

void Vec_WecPush(Vec_Wec_t *p,int Level,int Entry)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  size_t __size;
  int iVar6;
  
  if (p->nSize <= Level) {
    iVar6 = Level + 1;
    iVar3 = p->nSize * 2;
    if (iVar3 <= iVar6) {
      iVar3 = iVar6;
    }
    if (p->nCap < iVar3) {
      __size = (long)iVar3 << 4;
      if (p->pArray == (Vec_Int_t *)0x0) {
        pVVar4 = (Vec_Int_t *)malloc(__size);
      }
      else {
        pVVar4 = (Vec_Int_t *)realloc(p->pArray,__size);
      }
      p->pArray = pVVar4;
      memset(pVVar4 + p->nCap,0,((long)iVar3 - (long)p->nCap) * 0x10);
      p->nCap = iVar3;
    }
    p->nSize = iVar6;
  }
  if ((Level < 0) || (p->nSize <= Level)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar2 = p->pArray;
  pVVar4 = pVVar2 + (uint)Level;
  uVar1 = pVVar2[(uint)Level].nCap;
  if (pVVar2[(uint)Level].nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar4->pArray == (int *)0x0) {
        piVar5 = (int *)malloc(0x40);
      }
      else {
        piVar5 = (int *)realloc(pVVar4->pArray,0x40);
      }
      pVVar4->pArray = piVar5;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar1 * 2;
      if (iVar6 <= (int)uVar1) goto LAB_005a9161;
      if (pVVar4->pArray == (int *)0x0) {
        piVar5 = (int *)malloc((ulong)uVar1 << 3);
      }
      else {
        piVar5 = (int *)realloc(pVVar4->pArray,(ulong)uVar1 << 3);
      }
      pVVar4->pArray = piVar5;
    }
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar4->nCap = iVar6;
  }
LAB_005a9161:
  iVar6 = pVVar4->nSize;
  pVVar4->nSize = iVar6 + 1;
  pVVar4->pArray[iVar6] = Entry;
  return;
}

Assistant:

static inline void Vec_WecPush( Vec_Wec_t * p, int Level, int Entry )
{
    if ( p->nSize < Level + 1 )
    {
        Vec_WecGrow( p, Abc_MaxInt(2*p->nSize, Level + 1) );
        p->nSize = Level + 1;
    }
    Vec_IntPush( Vec_WecEntry(p, Level), Entry );
}